

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::absolute_indexed_indirect_jmp
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool param_1_local;
  AccessType param_0_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()
            (target,OperationConstructAbsoluteIndexedIndirect);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void absolute_indexed_indirect_jmp(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);						// AAL.
		target(CycleFetchPC);								// AAH.
		target(CycleFetchPCThrowaway);						// IO.
		target(OperationConstructAbsoluteIndexedIndirect);	// Calculate data address.
		target(CycleFetchIncrementData);					// New PCL
		target(CycleFetchData);								// New PCH.
		target(OperationPerform);							// [JMP]
	}